

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::RegexEs5SplitImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,CharCount limit,bool noResult,void *stackAllocationPointer)

{
  Type *addr;
  code *pcVar1;
  RegexFlags RVar2;
  bool bVar3;
  uint16 uVar4;
  charcount_t inputLength;
  JavascriptArray *arr;
  char16 *input_00;
  GroupInfo GVar5;
  Var newValue;
  undefined4 *puVar6;
  uint uVar7;
  CharCount CVar8;
  undefined7 in_register_00000081;
  GroupInfo lastSuccessfulMatch;
  ulong uVar9;
  uint offset;
  CharCount CVar10;
  BigIndex local_b0;
  undefined1 local_a0 [8];
  RegexMatchState state;
  uint local_50;
  ulong local_48;
  ScriptContext *local_40;
  
  CVar8 = (CharCount)CONCAT71(in_register_00000081,noResult);
  if ((CVar8 == 0) || (((scriptContext->config).threadConfig)->m_SkipSplitOnNoResult != true)) {
    RegexHelperTrace(scriptContext,Split,regularExpression,input);
    arr = JavascriptLibrary::CreateArrayOnStack
                    ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                     stackAllocationPointer);
    if (limit != 0) {
      local_40 = (ScriptContext *)(regularExpression->splitPattern).ptr;
      if (local_40 == (ScriptContext *)0x0) {
        addr = &regularExpression->splitPattern;
        local_40 = (ScriptContext *)(regularExpression->pattern).ptr;
        RVar2 = UnifiedRegex::RegexPattern::GetFlags((RegexPattern *)local_40);
        if ((RVar2 & StickyRegexFlag) != NoRegexFlags) {
          UnifiedRegex::RegexPattern::GetSource((RegexPattern *)local_a0);
          RVar2 = UnifiedRegex::RegexPattern::GetFlags((RegexPattern *)local_40);
          CVar8 = (local_40->super_ScriptContextBase).isClosed & 1;
          local_40 = (ScriptContext *)
                     CompileDynamic(scriptContext,
                                    (char16 *)((ulong)((uint)local_a0[4] * 2) + (long)state.input),
                                    local_a0._0_4_,RVar2 & ~StickyRegexFlag,SUB41(CVar8,0));
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = (RegexPattern *)local_40;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      input_00 = JavascriptString::GetString(input);
      inputLength = JavascriptString::GetLength(input);
      uVar4 = UnifiedRegex::RegexPattern::NumGroups((RegexPattern *)local_40);
      state.matcher =
           (Matcher *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      local_50 = 0;
      PrimBeginMatch((RegexMatchState *)local_a0,scriptContext,(RegexPattern *)local_40,input_00,
                     CVar8,false);
      if (inputLength == 0) {
        lastSuccessfulMatch.offset = 0;
        lastSuccessfulMatch.length = 0;
        GVar5 = PrimMatch((RegexMatchState *)local_a0,scriptContext,(RegexPattern *)local_40,0,0);
        if ((ulong)GVar5 < 0xffffffff00000000) {
          local_48 = (ulong)GVar5 >> 0x20;
          local_50 = GVar5.offset;
        }
        else {
          local_50 = 0;
          JavascriptArray::BigIndex::BigIndex(&local_b0,(arr->super_ArrayObject).length);
          JavascriptArray::BigIndex::SetItem(&local_b0,arr,input);
          local_48 = 0xffffffff;
        }
      }
      else {
        local_48 = 0xffffffff;
        offset = 0;
        CVar8 = 0;
        do {
          if (inputLength <= offset) break;
          GVar5 = PrimMatch((RegexMatchState *)local_a0,scriptContext,(RegexPattern *)local_40,
                            inputLength,offset);
          uVar9 = (ulong)GVar5 >> 0x20;
          if (uVar9 == 0xffffffff) {
LAB_00d4fd5c:
            bVar3 = false;
          }
          else {
            local_50 = GVar5.offset;
            local_48 = uVar9;
            if (local_50 < inputLength) {
              CVar10 = GVar5.length + local_50;
              if (CVar10 == CVar8) {
                bVar3 = true;
                offset = local_50 + 1;
              }
              else {
                AppendSubString(scriptContext,arr,input,CVar8,local_50);
                offset = local_50;
                if (limit <= (arr->super_ArrayObject).length) goto LAB_00d4fd5c;
                bVar3 = true;
                offset = CVar10;
                CVar8 = CVar10;
                if (1 < uVar4) {
                  uVar7 = 2;
                  do {
                    GVar5 = UnifiedRegex::RegexPattern::GetGroup((RegexPattern *)local_40,uVar7 - 1)
                    ;
                    newValue = GetString(scriptContext,input,state.matcher,GVar5);
                    JavascriptArray::BigIndex::BigIndex(&local_b0,(arr->super_ArrayObject).length);
                    JavascriptArray::BigIndex::SetItem(&local_b0,arr,newValue);
                    if (limit <= (arr->super_ArrayObject).length) break;
                    bVar3 = uVar7 < uVar4;
                    uVar7 = uVar7 + 1;
                  } while (bVar3);
                  bVar3 = true;
                }
              }
            }
            else {
              bVar3 = false;
            }
          }
        } while (bVar3);
        lastSuccessfulMatch.length = 0;
        lastSuccessfulMatch.offset = inputLength;
        if ((arr->super_ArrayObject).length < limit) {
          AppendSubString(scriptContext,arr,input,CVar8,inputLength);
        }
      }
      if (state.input != (char16 *)0x0) {
        ScriptContext::ReleaseTemporaryAllocator
                  (scriptContext,(TempArenaAllocatorObject *)state.input);
      }
      bVar3 = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)local_40);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x719,"(!splitPattern->IsSticky())","!splitPattern->IsSticky()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      bVar3 = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)local_40);
      PropagateLastMatchToRegex
                (local_40,bVar3,false,regularExpression,lastSuccessfulMatch,
                 (GroupInfo)0xffffffff00000000);
      PropagateLastMatchToCtor
                (scriptContext,regularExpression,input,
                 (GroupInfo)((ulong)local_50 | local_48 << 0x20),true);
    }
  }
  else {
    arr = (JavascriptArray *)
          (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).nullValue.ptr;
  }
  return arr;
}

Assistant:

Var RegexHelper::RegexEs5SplitImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, CharCount limit, bool noResult, void *const stackAllocationPointer)
    {
        if (noResult && scriptContext->GetConfig()->SkipSplitOnNoResult())
        {
            // TODO: Fix this so that the side effect for PropagateLastMatch is done
            return scriptContext->GetLibrary()->GetNull();
        }

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Split, regularExpression, input);
#endif

        JavascriptArray* ary = scriptContext->GetLibrary()->CreateArrayOnStack(stackAllocationPointer);

        if (limit == 0)
        {
            // SPECIAL CASE: Zero limit
            return ary;
        }

        UnifiedRegex::RegexPattern *splitPattern = GetSplitPattern(scriptContext, regularExpression);

        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength(); // s in spec
        const int numGroups = splitPattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, splitPattern, inputStr, inputLength, false);

        if (inputLength == 0)
        {
            // SPECIAL CASE: Empty string
            UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, 0);
            if (match.IsUndefined())
                ary->DirectAppendItem(input);
            else
                lastSuccessfulMatch = match;
        }
        else
        {
            CharCount copyOffset = 0;  // p in spec
            CharCount startOffset = 0; // q in spec

            CharCount inputLimit = inputLength;

            while (startOffset < inputLimit)
            {
                UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, startOffset);

                if (match.IsUndefined())
                    break;

                lastSuccessfulMatch = match;

                if (match.offset >= inputLimit)
                    break;

                startOffset = match.offset;
                CharCount endOffset = match.EndOffset(); // e in spec

                if (endOffset == copyOffset)
                    startOffset++;
                else
                {
                    AppendSubString(scriptContext, ary, input, copyOffset, startOffset);
                    if (ary->GetLength() >= limit)
                        break;

                    startOffset = copyOffset = endOffset;

                    for (int groupId = 1; groupId < numGroups; groupId++)
                    {
                        ary->DirectAppendItem(GetGroup(scriptContext, splitPattern, input, nonMatchValue, groupId));
                        if (ary->GetLength() >= limit)
                            break;
                    }
                }
            }

            if (ary->GetLength() < limit)
                AppendSubString(scriptContext, ary, input, copyOffset, inputLength);
        }

        PrimEndMatch(state, scriptContext, splitPattern);
        Assert(!splitPattern->IsSticky());
        PropagateLastMatch
            ( scriptContext
            , splitPattern->IsGlobal()
            , /* isSticky */ false
            , regularExpression
            , input
            , lastSuccessfulMatch
            , UnifiedRegex::GroupInfo()
            , /* updateRegex */ true
            , /* updateCtor */ true
            , /* useSplitPattern */ true );

        return ary;
    }